

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)

{
  void *pvVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint16_t level;
  uint8_t vsize_00;
  uint8_t ksize_00;
  int iVar4;
  size_t sVar5;
  char acStackY_c8 [12];
  char *key;
  size_t offset;
  ushort local_74;
  uint8_t vsize;
  uint8_t ksize;
  int n;
  idx_t idx;
  uint8_t v;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  stack0xffffffffffffff40 = 0x101aec;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  stack0xffffffffffffff40 = 0x101af9;
  memleak_start();
  uVar3 = stack0xffffffffffffff40;
  key = (char *)0x0;
  uVar2 = (ulong)stack0xffffffffffffff40 >> 0x38;
  ksize_00 = (uint8_t)uVar2;
  vsize_00 = (uint8_t)((ulong)uVar3 >> 0x30);
  level = (uint16_t)((ulong)uVar3 >> 0x20);
  unique0x1000037e = uVar3;
  _n = dummy_node(ksize_00,vsize_00,level);
  _n->nentry = 10;
  ksize = 'd';
  local_74 = 0;
  do {
    if (9 < local_74) {
      free(_n);
      memleak_end();
      if (kv_set_var_nentry_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","kv_set_var_nentry_test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","kv_set_var_nentry_test");
      }
      return;
    }
    sprintf(acStackY_c8,"key%d",(ulong)local_74);
    (*kv_ops->set_kv)(_n,local_74,acStackY_c8,&ksize);
    pvVar1 = (_n->field_4).data;
    sVar5 = strlen(acStackY_c8);
    iVar4 = memcmp((char *)((long)pvVar1 + (long)key),acStackY_c8,sVar5);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x9d);
      kv_set_var_nentry_test::__test_pass = 0;
      pvVar1 = (_n->field_4).data;
      sVar5 = strlen(acStackY_c8);
      iVar4 = memcmp((char *)((long)pvVar1 + (long)key),acStackY_c8,sVar5);
      if (iVar4 != 0) {
        __assert_fail("!memcmp((uint8_t *)node->data + offset, key, strlen(key))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x9d,"void kv_set_var_nentry_test(btree_kv_ops *)");
      }
    }
    iVar4 = memcmp((char *)((long)(_n->field_4).data + (long)(key + 8)),&ksize,1);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x9f);
      kv_set_var_nentry_test::__test_pass = 0;
      iVar4 = memcmp((char *)((long)(_n->field_4).data + (long)(key + 8)),&ksize,1);
      if (iVar4 != 0) {
        __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x9f,"void kv_set_var_nentry_test(btree_kv_ops *)");
      }
    }
    key = key + 9;
    ksize = ksize + '\x01';
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char *key = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    for (idx = 0; idx < n; idx ++){

        // set key/value
        sprintf(key, "key%d", idx);
        kv_ops->set_kv(node, idx, key, (void *)&v);

        // verify
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key, strlen(key)));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

        // update value
        v++;

    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_test");
}